

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O3

void sensors_analytics::utils::ObjectNode::DumpNode(ObjectNode *node,string *buffer)

{
  bool bVar1;
  long *plVar2;
  _Base_ptr p_Var3;
  long *plVar4;
  char cVar5;
  _Rb_tree_header *p_Var6;
  long *local_70;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  cVar5 = (char)buffer;
  std::__cxx11::string::push_back(cVar5);
  p_Var3 = (node->properties_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var6 = &(node->properties_map_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var6) {
    bVar1 = true;
    do {
      if (!bVar1) {
        std::__cxx11::string::push_back(cVar5);
      }
      std::operator+(&local_50,'\"',
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var3 + 1));
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
      plVar4 = plVar2 + 2;
      if ((long *)*plVar2 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = plVar2[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*plVar2;
      }
      *plVar2 = (long)plVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__cxx11::string::_M_append((char *)buffer,(ulong)local_70);
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      ValueNode::ToStr((ValueNode *)(p_Var3 + 2),buffer);
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      bVar1 = false;
    } while ((_Rb_tree_header *)p_Var3 != p_Var6);
  }
  std::__cxx11::string::push_back(cVar5);
  return;
}

Assistant:

void ObjectNode::DumpNode(const ObjectNode &node, string *buffer) {
  *buffer += '{';
  bool first = true;

  for (std::map<string, ValueNode>::const_iterator
           iterator = node.properties_map_.begin();
       iterator != node.properties_map_.end(); ++iterator) {
    if (first) {
      first = false;
    } else {
      *buffer += ',';
    }
    *buffer += '"' + iterator->first + "\":";
    ValueNode::ToStr(iterator->second, buffer);
  }
  *buffer += '}';
}